

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdGraph.cpp
# Opt level: O1

void __thiscall HACD::Graph::Print(Graph *this)

{
  ostream *poVar1;
  pointer pGVar2;
  ulong uVar3;
  pointer pGVar4;
  ulong uVar5;
  long lVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-----------------------------",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vertices (",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  pGVar4 = (this->m_vertices).
           super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_vertices).super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>.
      _M_impl.super__Vector_impl_data._M_finish != pGVar4) {
    uVar3 = 0;
    do {
      if (pGVar4[uVar3].m_deleted == false) {
        poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
        if (pGVar4[uVar3].m_edges.m_size != 0) {
          uVar5 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
            poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
            poVar1 = std::ostream::_M_insert<long>((long)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,") ",2);
            uVar5 = uVar5 + 1;
          } while (uVar5 < pGVar4[uVar3].m_edges.m_size);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
        std::ostream::put(-0x20);
        std::ostream::flush();
      }
      uVar3 = uVar3 + 1;
      pGVar4 = (this->m_vertices).
               super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)(((long)(this->m_vertices).
                                    super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar4 >> 4)
                            * 0x7d6343eb1a1f58d1));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vertices (",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  pGVar2 = (this->m_edges).super__Vector_base<HACD::GraphEdge,_std::allocator<HACD::GraphEdge>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_edges).super__Vector_base<HACD::GraphEdge,_std::allocator<HACD::GraphEdge>_>._M_impl.
      super__Vector_impl_data._M_finish != pGVar2) {
    lVar6 = 0;
    uVar3 = 0;
    do {
      if ((&pGVar2->m_deleted)[lVar6] == false) {
        poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t(",2);
        poVar1 = std::ostream::_M_insert<long>((long)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
        poVar1 = std::ostream::_M_insert<long>((long)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,") ",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
      }
      uVar3 = uVar3 + 1;
      pGVar2 = (this->m_edges).super__Vector_base<HACD::GraphEdge,_std::allocator<HACD::GraphEdge>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x30;
    } while (uVar3 < (ulong)(((long)(this->m_edges).
                                    super__Vector_base<HACD::GraphEdge,_std::allocator<HACD::GraphEdge>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar2 >> 4)
                            * -0x5555555555555555));
  }
  return;
}

Assistant:

void Graph::Print() const
	{
		std::cout << "-----------------------------" << std::endl;
        std::cout << "vertices (" << m_nV << ")" << std::endl;
        for (size_t v = 0; v < m_vertices.size(); ++v) 
		{
			const GraphVertex & currentVertex = m_vertices[v];
			if (!m_vertices[v].m_deleted)
			{

				std::cout  << currentVertex.m_name	  << "\t";
				long idEdge;
				for(size_t ed = 0; ed < currentVertex.m_edges.Size(); ++ed) 
				{
                    idEdge = currentVertex.m_edges[ed];
					std::cout  << "(" << m_edges[idEdge].m_v1 << "," << m_edges[idEdge].m_v2 << ") "; 	  
				}
				std::cout << std::endl;
			}			
		}

		std::cout << "vertices (" << m_nE << ")" << std::endl;
		for (size_t e = 0; e < m_edges.size(); ++e) 
		{
			const GraphEdge & currentEdge = m_edges[e];
			if (!m_edges[e].m_deleted)
			{
				std::cout  << currentEdge.m_name	  << "\t(" 
						   << m_edges[e].m_v1		  << "," 
						   << m_edges[e].m_v2		  << ") "<< std::endl;
			}			
		}
	}